

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void __thiscall AActor::CallBeginPlay(AActor *this)

{
  VMFunction *func;
  PClass *pPVar1;
  VMFrameStack *this_00;
  VMValue params [1];
  
  if (CallBeginPlay::VIndex == 0xffffffff) {
    CallBeginPlay::VIndex = GetVirtualIndex(RegistrationInfo.MyClass,"BeginPlay");
    if (CallBeginPlay::VIndex == 0xffffffff) {
      __assert_fail("VIndex != ~0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x12ac,"void AActor::CallBeginPlay()");
    }
  }
  pPVar1 = DObject::GetClass((DObject *)this);
  if ((CallBeginPlay::VIndex < (pPVar1->Virtuals).Count) &&
     (func = (pPVar1->Virtuals).Array[CallBeginPlay::VIndex], func != (VMFunction *)0x0)) {
    params[0].field_0.field_1.atag = 1;
    params[0].field_0.field_3.Type = '\x03';
    params[0].field_0._0_8_ = this;
    this_00 = (VMFrameStack *)_ZTW13GlobalVMStack();
    VMFrameStack::Call(this_00,func,params,1,(VMReturn *)0x0,0,(VMException **)0x0);
    VMValue::~VMValue(params);
    return;
  }
  (*(this->super_DThinker).super_DObject._vptr_DObject[10])(this);
  return;
}

Assistant:

void AActor::CallBeginPlay()
{
	IFVIRTUAL(AActor, BeginPlay)
	{
		// Without the type cast this picks the 'void *' assignment...
		VMValue params[1] = { (DObject*)this };
		GlobalVMStack.Call(func, params, 1, nullptr, 0, nullptr);
	}
	else BeginPlay();
}